

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3MemCompare(Mem *pMem1,Mem *pMem2,CollSeq *pColl)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  long in_RDX;
  double *in_RSI;
  Mem *in_RDI;
  Mem *unaff_retaddr;
  int combined_flags;
  int f2;
  int f1;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar1 = in_RDI->flags;
  uVar2 = *(ushort *)((long)in_RSI + 0x14);
  uVar4 = (uint)uVar2;
  uVar3 = uVar1 | uVar2;
  if ((uVar3 & 1) == 0) {
    if ((uVar3 & 0x2c) == 0) {
      if ((uVar3 & 2) != 0) {
        if ((uVar1 & 2) == 0) {
          return 1;
        }
        if ((uVar2 & 2) == 0) {
          return -1;
        }
        if (in_RDX != 0) {
          iVar5 = vdbeCompareMemString
                            (unaff_retaddr,
                             (Mem *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (CollSeq *)in_RDI,(u8 *)in_RSI);
          return iVar5;
        }
      }
      iVar5 = sqlite3BlobCompare((Mem *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8
                                                ),in_RDI);
    }
    else if ((uVar1 & uVar2 & 0x24) == 0) {
      if ((uVar1 & uVar2 & 8) == 0) {
        if ((uVar1 & 0x24) == 0) {
          if ((uVar1 & 8) == 0) {
            iVar5 = 1;
          }
          else if ((uVar2 & 0x24) == 0) {
            iVar5 = -1;
          }
          else {
            iVar5 = sqlite3IntFloatCompare
                              ((ulong)CONCAT24(uVar1,uVar4),
                               (double)(ulong)CONCAT24(uVar3,in_stack_ffffffffffffffd0));
            iVar5 = -iVar5;
          }
        }
        else if ((uVar2 & 8) == 0) {
          if ((uVar2 & 0x24) == 0) {
            iVar5 = -1;
          }
          else if ((in_RDI->u).i < (long)*in_RSI) {
            iVar5 = -1;
          }
          else if ((long)*in_RSI < (in_RDI->u).i) {
            iVar5 = 1;
          }
          else {
            iVar5 = 0;
          }
        }
        else {
          iVar5 = sqlite3IntFloatCompare
                            ((ulong)CONCAT24(uVar1,uVar4),
                             (double)(ulong)CONCAT24(uVar3,in_stack_ffffffffffffffd0));
        }
      }
      else if (*in_RSI <= (in_RDI->u).r) {
        if ((in_RDI->u).r < *in_RSI || (in_RDI->u).r == *in_RSI) {
          iVar5 = 0;
        }
        else {
          iVar5 = 1;
        }
      }
      else {
        iVar5 = -1;
      }
    }
    else if ((in_RDI->u).i < (long)*in_RSI) {
      iVar5 = -1;
    }
    else if ((long)*in_RSI < (in_RDI->u).i) {
      iVar5 = 1;
    }
    else {
      iVar5 = 0;
    }
  }
  else {
    iVar5 = (uVar4 & 1) - (uVar1 & 1);
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3MemCompare(const Mem *pMem1, const Mem *pMem2, const CollSeq *pColl){
  int f1, f2;
  int combined_flags;

  f1 = pMem1->flags;
  f2 = pMem2->flags;
  combined_flags = f1|f2;
  assert( !sqlite3VdbeMemIsRowSet(pMem1) && !sqlite3VdbeMemIsRowSet(pMem2) );

  /* If one value is NULL, it is less than the other. If both values
  ** are NULL, return 0.
  */
  if( combined_flags&MEM_Null ){
    return (f2&MEM_Null) - (f1&MEM_Null);
  }

  /* At least one of the two values is a number
  */
  if( combined_flags&(MEM_Int|MEM_Real|MEM_IntReal) ){
    testcase( combined_flags & MEM_Int );
    testcase( combined_flags & MEM_Real );
    testcase( combined_flags & MEM_IntReal );
    if( (f1 & f2 & (MEM_Int|MEM_IntReal))!=0 ){
      testcase( f1 & f2 & MEM_Int );
      testcase( f1 & f2 & MEM_IntReal );
      if( pMem1->u.i < pMem2->u.i ) return -1;
      if( pMem1->u.i > pMem2->u.i ) return +1;
      return 0;
    }
    if( (f1 & f2 & MEM_Real)!=0 ){
      if( pMem1->u.r < pMem2->u.r ) return -1;
      if( pMem1->u.r > pMem2->u.r ) return +1;
      return 0;
    }
    if( (f1&(MEM_Int|MEM_IntReal))!=0 ){
      testcase( f1 & MEM_Int );
      testcase( f1 & MEM_IntReal );
      if( (f2&MEM_Real)!=0 ){
        return sqlite3IntFloatCompare(pMem1->u.i, pMem2->u.r);
      }else if( (f2&(MEM_Int|MEM_IntReal))!=0 ){
        if( pMem1->u.i < pMem2->u.i ) return -1;
        if( pMem1->u.i > pMem2->u.i ) return +1;
        return 0;
      }else{
        return -1;
      }
    }
    if( (f1&MEM_Real)!=0 ){
      if( (f2&(MEM_Int|MEM_IntReal))!=0 ){
        testcase( f2 & MEM_Int );
        testcase( f2 & MEM_IntReal );
        return -sqlite3IntFloatCompare(pMem2->u.i, pMem1->u.r);
      }else{
        return -1;
      }
    }
    return +1;
  }

  /* If one value is a string and the other is a blob, the string is less.
  ** If both are strings, compare using the collating functions.
  */
  if( combined_flags&MEM_Str ){
    if( (f1 & MEM_Str)==0 ){
      return 1;
    }
    if( (f2 & MEM_Str)==0 ){
      return -1;
    }

    assert( pMem1->enc==pMem2->enc || pMem1->db->mallocFailed );
    assert( pMem1->enc==SQLITE_UTF8 ||
            pMem1->enc==SQLITE_UTF16LE || pMem1->enc==SQLITE_UTF16BE );

    /* The collation sequence must be defined at this point, even if
    ** the user deletes the collation sequence after the vdbe program is
    ** compiled (this was not always the case).
    */
    assert( !pColl || pColl->xCmp );

    if( pColl ){
      return vdbeCompareMemString(pMem1, pMem2, pColl, 0);
    }
    /* If a NULL pointer was passed as the collate function, fall through
    ** to the blob case and use memcmp().  */
  }

  /* Both values must be blobs.  Compare using memcmp().  */
  return sqlite3BlobCompare(pMem1, pMem2);
}